

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mioUtils.c
# Opt level: O3

void Mio_LibraryDelete(Mio_Library_t *pLib)

{
  Vec_Str_t *__ptr;
  char *__ptr_00;
  Abc_Frame_t *p;
  Mio_Gate_t *pGate;
  Mio_Gate_t *pMVar1;
  
  if (pLib != (Mio_Library_t *)0x0) {
    Mio_LibraryMatchesStop(pLib);
    Mio_LibraryMatches2Stop(pLib);
    p = Abc_FrameGetGlobalFrame();
    Abc_FrameUnmapAllNetworks(p);
    if (pLib->pName != (char *)0x0) {
      free(pLib->pName);
      pLib->pName = (char *)0x0;
    }
    pGate = Mio_LibraryReadGates(pLib);
    while (pGate != (Mio_Gate_t *)0x0) {
      pMVar1 = Mio_GateReadNext(pGate);
      Mio_GateDelete(pGate);
      pGate = pMVar1;
    }
    Mem_FlexStop(pLib->pMmFlex,0);
    __ptr = pLib->vCube;
    __ptr_00 = __ptr->pArray;
    if (__ptr_00 != (char *)0x0) {
      free(__ptr_00);
    }
    free(__ptr);
    if (pLib->tName2Gate != (st__table *)0x0) {
      st__free_table(pLib->tName2Gate);
    }
    if (pLib->ppGates0 != (Mio_Gate_t **)0x0) {
      free(pLib->ppGates0);
      pLib->ppGates0 = (Mio_Gate_t **)0x0;
    }
    if (pLib->ppGatesName != (Mio_Gate_t **)0x0) {
      free(pLib->ppGatesName);
    }
    free(pLib);
    return;
  }
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Mio_LibraryDelete( Mio_Library_t * pLib )
{
    Mio_Gate_t * pGate, * pGate2;
    if ( pLib == NULL )
        return;
    Mio_LibraryMatchesStop( pLib );
    Mio_LibraryMatches2Stop( pLib );
    // free the bindings of nodes to gates from this library for all networks
    Abc_FrameUnmapAllNetworks( Abc_FrameGetGlobalFrame() );
    // free the library
    ABC_FREE( pLib->pName );
    Mio_LibraryForEachGateSafe( pLib, pGate, pGate2 )
        Mio_GateDelete( pGate );
    Mem_FlexStop( pLib->pMmFlex, 0 );
    Vec_StrFree( pLib->vCube );
    if ( pLib->tName2Gate )
        st__free_table( pLib->tName2Gate );
//    if ( pLib->dd )
//        Cudd_Quit( pLib->dd );
    ABC_FREE( pLib->ppGates0 );
    ABC_FREE( pLib->ppGatesName );
    ABC_FREE( pLib );
}